

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall liblogger::LogFile::Rotate(LogFile *this)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  LogException *this_00;
  string *message;
  int *piVar4;
  undefined8 uVar5;
  FILE *pFVar6;
  long in_RDI;
  stringstream ss_1;
  stringstream ss;
  string *in_stack_fffffffffffffc68;
  LogException *in_stack_fffffffffffffc70;
  stringstream local_350 [16];
  ostream local_340 [383];
  undefined1 local_1c1;
  stringstream local_190 [16];
  ostream local_180 [384];
  
  if ((*(long *)(in_RDI + 0x28) != 0) && (iVar1 = fclose(*(FILE **)(in_RDI + 0x28)), iVar1 < 0)) {
    std::__cxx11::stringstream::stringstream(local_190);
    poVar2 = std::operator<<(local_180,"failed to close to file \'");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    this_00 = (LogException *)std::operator<<(poVar2,pcVar3);
    message = (string *)std::operator<<((ostream *)this_00,"\' error:");
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    std::operator<<((ostream *)message,pcVar3);
    local_1c1 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(this_00,message);
    local_1c1 = 0;
    __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pFVar6 = fopen(pcVar3,"a");
  *(FILE **)(in_RDI + 0x28) = pFVar6;
  if (*(long *)(in_RDI + 0x28) != 0) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_350);
  poVar2 = std::operator<<(local_340,"Cannot open file: \'");
  poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 8));
  std::operator<<(poVar2,"\'");
  uVar5 = __cxa_allocate_exception(0x28);
  std::__cxx11::stringstream::str();
  LogException::LogException(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogFile::Rotate()
{
	if (m_fp != NULL)
	{
		if (fclose(m_fp) < 0)
		{
			std::stringstream ss;
			ss << "failed to close to file '" << m_fname.c_str() << "' error:" << strerror(errno);
			throw(LogException(ss.str()));
		}
	}

	m_fp = fopen(m_fname.c_str(), "a");
	if (m_fp == NULL)
	{
		std::stringstream ss;
		ss << "Cannot open file: '" << m_fname << "'";
		throw(LogException(ss.str()));
	}
}